

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<MyTest>::AddTestPattern
          (ParameterizedTestSuiteInfo<MyTest> *this,char *param_2,char *test_base_name,
          TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_> *meta_factory,
          CodeLocation *code_location)

{
  CodeLocation *this_00;
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>_>_>
  *this_01;
  CodeLocation *in_RCX;
  long in_RDI;
  TestInfo **in_R8;
  CodeLocation *in_stack_ffffffffffffff58;
  TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_> *a_test_meta_factory;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff9c;
  TestInfo *in_stack_ffffffffffffffa0;
  TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_> local_58 [5];
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>_>_>
  *local_30;
  CodeLocation *local_20;
  
  this_00 = (CodeLocation *)(in_RDI + 0x50);
  local_20 = in_RCX;
  this_01 = (vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>_>_>
             *)operator_new(0x50);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
  a_test_meta_factory = local_58;
  CodeLocation::CodeLocation(this_00,in_stack_ffffffffffffff58);
  TestInfo::TestInfo(in_stack_ffffffffffffffa0,(char *)CONCAT44(in_stack_ffffffffffffff9c,uVar1),
                     a_test_meta_factory,local_20);
  local_30 = this_01;
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>>>
  ::emplace_back<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo*>(this_01,in_R8);
  CodeLocation::~CodeLocation((CodeLocation *)0x1bca71);
  return;
}

Assistant:

void AddTestPattern(const char*, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.emplace_back(
        new TestInfo(test_base_name, meta_factory, std::move(code_location)));
  }